

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int expected_errors;
  int old_leaks;
  int old_tests;
  int old_errors;
  int ret;
  char **argv_local;
  int argc_local;
  
  logfile = (FILE *)fopen64("runsuite.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    fprintf(_stderr,"Could not open the log file, running in verbose mode\n");
    verbose = 1;
  }
  initializeLibxml2();
  if (1 < argc) {
    iVar3 = strcmp(argv[1],"-v");
    if (iVar3 == 0) {
      verbose = 1;
    }
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  xsdTest();
  printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
         (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  if (nb_errors - iVar3 == 3) {
    printf("%d errors were expected\n",3);
    nb_errors = iVar3;
  }
  else {
    printf("%d errors were expected, got %d errors\n",3,(ulong)(uint)(nb_errors - iVar3));
    nb_errors = iVar3 + 1;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  rngTest1();
  if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  rngTest2();
  if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet","xstc/Tests/Metadata/");
  if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    printf("Some errors were expected.\n");
    nb_errors = iVar3;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar3 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    printf("Some errors were expected.\n");
    nb_errors = iVar3;
  }
  if ((nb_errors == 0) && (nb_leaks == 0)) {
    old_tests = 0;
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    old_tests = 1;
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
           (ulong)(uint)nb_leaks);
  }
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return old_tests;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int ret = 0;
    int old_errors, old_tests, old_leaks, expected_errors;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    if ((argc >= 2) && (!strcmp(argv[1], "-v")))
        verbose = 1;


    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xsdTest();
    expected_errors = 3;
    printf("Ran %d tests, %d errors, %d leaks\n",
           nb_tests - old_tests,
           nb_errors - old_errors,
           nb_leaks - old_leaks);
    if (nb_errors - old_errors == expected_errors) {
        printf("%d errors were expected\n", expected_errors);
        nb_errors = old_errors;
    } else {
        printf("%d errors were expected, got %d errors\n",
               expected_errors, nb_errors - old_errors);
        nb_errors = old_errors + 1;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest1();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest2();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet",
		 "xstc/Tests/Metadata/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }

    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}